

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make_constant<cs::numeric,cs::numeric_const&>(numeric *args)

{
  holder<cs::numeric> *args_1;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RSI;
  numeric *in_RDI;
  numeric *args_2;
  allocator_type<cs_impl::any::holder<cs::numeric>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 2;
  uVar1 = 1;
  args_2 = in_RDI;
  args_1 = cs::
           allocator_type<cs_impl::any::holder<cs::numeric>,64ul,cs_impl::default_allocator_provider>
           ::alloc<cs::numeric_const&>(in_stack_ffffffffffffffe0,in_RDI);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::numeric>*>
                  (in_RSI,(int *)CONCAT44(uVar2,uVar1),(int *)args_1,(holder<cs::numeric> **)args_2)
  ;
  any((any *)in_RDI,dat);
  return (any)(proxy *)args_2;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}